

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_CircularBuffer.h
# Opt level: O2

size_t __thiscall
axl::sl::CircularBufferBase<wchar_t>::writeBack
          (CircularBufferBase<wchar_t> *this,wchar_t *p,size_t length)

{
  ulong length_00;
  
  length_00 = (this->m_buffer).super_ArrayRef<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>.m_count -
              this->m_length;
  if (length <= length_00) {
    length_00 = length;
  }
  copyTo(this,this->m_back,p,length_00);
  this->m_back = (this->m_back + length_00) %
                 (this->m_buffer).super_ArrayRef<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>.m_count;
  this->m_length = this->m_length + length_00;
  return length_00;
}

Assistant:

size_t
	writeBack(
		const C* p,
		size_t length
	) {
		size_t leftover = m_buffer.getCount() - m_length;
		if (length > leftover)
			length = leftover;

		copyTo(m_back, p, length);
		m_back = (m_back + length) % m_buffer.getCount();
		m_length += length;

		ASSERT(isValid());
		return length;
	}